

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

SimpleTypeHandler<1UL> * __thiscall
Js::SimpleTypeHandler<1UL>::ConvertToNonSharedSimpleType
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance)

{
  code *pcVar1;
  BYTE values;
  bool bVar2;
  PropertyTypes values_00;
  Recycler *pRVar3;
  SimpleTypeHandler<1UL> *pSVar4;
  undefined4 *puVar5;
  TrackAllocData local_58;
  SimpleTypeHandler<1UL> *local_30;
  SimpleTypeHandler<1UL> *newTypeHandler;
  Recycler *recycler;
  ScriptContext *scriptContext;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  scriptContext = (ScriptContext *)instance;
  instance_local = (DynamicObject *)this;
  recycler = (Recycler *)RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pRVar3 = ScriptContext::GetRecycler((ScriptContext *)recycler);
  newTypeHandler = (SimpleTypeHandler<1UL> *)pRVar3;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&SimpleTypeHandler<1ul>::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
             ,0x6e);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_58);
  pSVar4 = (SimpleTypeHandler<1UL> *)new<Memory::Recycler>(0x30,pRVar3,0x43c4b0);
  SimpleTypeHandler(pSVar4,this,true);
  local_30 = pSVar4;
  values = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetFlags((DynamicTypeHandler *)pSVar4,'\"',values);
  bVar2 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&local_30->super_DynamicTypeHandler);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x75,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar4 = local_30;
  values_00 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes(&pSVar4->super_DynamicTypeHandler,0xb0,values_00);
  DynamicTypeHandler::SetInstanceTypeHandler
            (&local_30->super_DynamicTypeHandler,(DynamicObject *)scriptContext,true);
  return local_30;
}

Assistant:

SimpleTypeHandler<size> * SimpleTypeHandler<size>::ConvertToNonSharedSimpleType(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();


        CompileAssert(_countof(descriptors) == size);

        SimpleTypeHandler * newTypeHandler = RecyclerNew(recycler, SimpleTypeHandler, this, true /*unused*/);

        // Consider: Add support for fixed fields to SimpleTypeHandler when
        // non-shared.  Here we could set the instance as the singleton instance on the newly
        // created handler.

        newTypeHandler->SetFlags(IsPrototypeFlag | HasKnownSlot0Flag, this->GetFlags());
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

        return newTypeHandler;
    }